

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O0

void reset_entrance_data(chunk_conflict *c)

{
  int **ppiVar1;
  int *piVar2;
  int local_18;
  int local_14;
  wchar_t j;
  wchar_t i;
  chunk_conflict *c_local;
  
  for (local_14 = 0; local_14 < (int)(uint)z_info->level_room_max; local_14 = local_14 + 1) {
    dun->ent_n[local_14] = 0;
  }
  if (dun->ent2room != (int **)0x0) {
    for (local_14 = 0; dun->ent2room[local_14] != (int *)0x0; local_14 = local_14 + 1) {
      mem_free(dun->ent2room[local_14]);
    }
    mem_free(dun->ent2room);
  }
  ppiVar1 = (int **)mem_alloc((long)(c->height + 1) << 3);
  dun->ent2room = ppiVar1;
  for (local_14 = 0; local_14 < c->height; local_14 = local_14 + 1) {
    piVar2 = (int *)mem_alloc((long)c->width << 2);
    dun->ent2room[local_14] = piVar2;
    for (local_18 = 0; local_18 < c->width; local_18 = local_18 + 1) {
      dun->ent2room[local_14][local_18] = -1;
    }
  }
  dun->ent2room[c->height] = (int *)0x0;
  return;
}

Assistant:

static void reset_entrance_data(const struct chunk *c)
{
	int i;

	for (i = 0; i < z_info->level_room_max; ++i) {
		dun->ent_n[i] = 0;
	}
	if (dun->ent2room) {
		for (i = 0; dun->ent2room[i]; ++i) {
			mem_free(dun->ent2room[i]);
		}
		mem_free(dun->ent2room);
	}
	/* Add a trailing NULL so the deallocation knows when to stop. */
	dun->ent2room = mem_alloc((c->height + 1) * sizeof(*dun->ent2room));
	for (i = 0; i < c->height; ++i) {
		int j;

		dun->ent2room[i] =
			mem_alloc(c->width * sizeof(*dun->ent2room[i]));
		for (j = 0; j < c->width; ++j) {
			dun->ent2room[i][j] = -1;
		}
	}
	dun->ent2room[c->height] = NULL;
}